

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::GlobFunctionBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Head_base<0UL,_duckdb::GlobFunctionBindData_*,_false> _Var1;
  ClientContext *context_00;
  reference pvVar2;
  pointer pGVar3;
  _Head_base<0UL,_duckdb::GlobFunctionBindData_*,_false> local_50;
  __uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_> local_48;
  shared_ptr<duckdb::MultiFileList,_true> local_40;
  
  make_uniq<duckdb::GlobFunctionBindData>();
  MultiFileReader::Create((MultiFileReader *)&local_48,input->table_function);
  context_00 = (ClientContext *)
               unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                             *)&local_48);
  pvVar2 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)&local_40,context_00,(Value *)context,(FileGlobOptions)pvVar2);
  pGVar3 = unique_ptr<duckdb::GlobFunctionBindData,_std::default_delete<duckdb::GlobFunctionBindData>,_true>
           ::operator->((unique_ptr<duckdb::GlobFunctionBindData,_std::default_delete<duckdb::GlobFunctionBindData>,_true>
                         *)&local_50);
  shared_ptr<duckdb::MultiFileList,_true>::operator=(&pGVar3->file_list,&local_40);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.internal.
              super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [5])0x1fe27b7);
  _Var1._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (GlobFunctionBindData *)0x0;
  *(GlobFunctionBindData **)this = _Var1._M_head_impl;
  if (local_48._M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
      .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>)
      0x0) {
    (**(code **)(*(_func_int **)
                  local_48._M_t.
                  super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
                  .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl + 8))();
    if (local_50._M_head_impl != (GlobFunctionBindData *)0x0) {
      (*((local_50._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData[1])
                ();
    }
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> GlobFunctionBind(ClientContext &context, TableFunctionBindInput &input,
                                                 vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<GlobFunctionBindData>();
	auto multi_file_reader = MultiFileReader::Create(input.table_function);
	result->file_list = multi_file_reader->CreateFileList(context, input.inputs[0], FileGlobOptions::ALLOW_EMPTY);
	return_types.emplace_back(LogicalType::VARCHAR);
	names.emplace_back("file");
	return std::move(result);
}